

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

Am_Wrapper * quit_or_exit_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_String local_48;
  undefined4 local_3c;
  Am_String local_38;
  Am_Widget_Look local_30 [2];
  Am_Widget_Look look;
  Am_Object local_20;
  Am_Object widget;
  Am_Object *self_local;
  
  widget.data = (Am_Object_Data *)self;
  pAVar2 = Am_Object::Get(self,0x170,3);
  Am_Object::Am_Object(&local_20,pAVar2);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_20,0x17f,4);
    Am_Widget_Look::Am_Widget_Look(local_30,pAVar2);
    bVar1 = Am_Widget_Look::operator==(local_30,&Am_WINDOWS_LOOK);
    if (bVar1) {
      Am_String::Am_String(&local_38,"Exit",true);
      self_local = (Am_Object *)Am_String::operator_cast_to_Am_Wrapper_(&local_38);
      Am_String::~Am_String(&local_38);
      goto LAB_003209a3;
    }
  }
  Am_String::Am_String(&local_48,"Quit",true);
  self_local = (Am_Object *)Am_String::operator_cast_to_Am_Wrapper_(&local_48);
  Am_String::~Am_String(&local_48);
LAB_003209a3:
  local_3c = 1;
  Am_Object::~Am_Object(&local_20);
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_String_Formula(quit_or_exit)
{
  Am_Object widget = self.Get(Am_SAVED_OLD_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (widget.Valid()) {
    Am_Widget_Look look = widget.Get(Am_WIDGET_LOOK, Am_NO_DEPENDENCY);
    if (look == Am_WINDOWS_LOOK)
      return Am_String("Exit");
  }
  return Am_String("Quit");
}